

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.hpp
# Opt level: O0

void __thiscall ruckig::RuckigError::RuckigError(RuckigError *this,string *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *message_local;
  RuckigError *this_local;
  
  local_18 = message;
  message_local = (string *)this;
  std::operator+(&local_38,"\n[ruckig] ",message);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)this = &PTR__RuckigError_0028ea40;
  return;
}

Assistant:

explicit RuckigError(const std::string& message): std::runtime_error("\n[ruckig] " + message) { }